

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_resetHighsOptions(void *highs)

{
  HighsStatus HVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Highs_resetHighsOptions",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Highs_resetOptions",&local_4a);
  Highs::deprecationMessage((Highs *)highs,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  HVar1 = Highs::resetOptions((Highs *)highs);
  return HVar1;
}

Assistant:

HighsInt Highs_resetHighsOptions(void* highs) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_resetHighsOptions", "Highs_resetOptions");
  return Highs_resetOptions(highs);
}